

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O2

mod2sparse * mod2sparse_allocate(int n_rows,int n_cols)

{
  long lVar1;
  mod2entry *pmVar2;
  mod2sparse *pmVar3;
  mod2entry *pmVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  if ((0 < n_rows) && (uVar5 = (ulong)(uint)n_cols, 0 < n_cols)) {
    pmVar3 = (mod2sparse *)chk_alloc(1,0x28);
    pmVar3->n_rows = n_rows;
    pmVar3->n_cols = n_cols;
    pmVar4 = (mod2entry *)chk_alloc(n_rows,0x38);
    pmVar3->rows = pmVar4;
    pmVar4 = (mod2entry *)chk_alloc(n_cols,0x38);
    pmVar3->cols = pmVar4;
    pmVar3->blocks = (mod2block *)0x0;
    pmVar3->next_free = (mod2entry *)0x0;
    for (lVar6 = 0; (ulong)(uint)n_rows * 0x38 - lVar6 != 0; lVar6 = lVar6 + 0x38) {
      pmVar2 = pmVar3->rows;
      lVar1 = (long)&pmVar2->row + lVar6;
      *(long *)((long)&pmVar2->down + lVar6) = lVar1;
      *(long *)((long)&pmVar2->up + lVar6) = lVar1;
      *(long *)((long)&pmVar2->right + lVar6) = lVar1;
      *(long *)((long)&pmVar2->left + lVar6) = lVar1;
      *(undefined8 *)((long)&pmVar2->row + lVar6) = 0xffffffffffffffff;
    }
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      pmVar4->down = pmVar4;
      pmVar4->up = pmVar4;
      pmVar4->right = pmVar4;
      pmVar4->left = pmVar4;
      pmVar4->row = -1;
      pmVar4->col = -1;
      pmVar4 = pmVar4 + 1;
    }
    return pmVar3;
  }
  fwrite("mod2sparse_allocate: Invalid number of rows or columns\n",0x37,1,_stderr);
  exit(1);
}

Assistant:

mod2sparse *mod2sparse_allocate
( int n_rows, 		/* Number of rows in matrix */
  int n_cols		/* Number of columns in matrix */
)
{
  mod2sparse *m;
  mod2entry *e;
  int i, j;

  if (n_rows<=0 || n_cols<=0)
  { fprintf(stderr,"mod2sparse_allocate: Invalid number of rows or columns\n");
    exit(1);
  }

  m = chk_alloc (1, sizeof *m);

  m->n_rows = n_rows;
  m->n_cols = n_cols;

  m->rows = chk_alloc (n_rows, sizeof *m->rows);
  m->cols = chk_alloc (n_cols, sizeof *m->cols);

  m->blocks = 0;
  m->next_free = 0;

  for (i = 0; i<n_rows; i++)
  { e = &m->rows[i];
    e->left = e->right = e->up = e->down = e;
    e->row = e->col = -1;
  }

  for (j = 0; j<n_cols; j++)
  { e = &m->cols[j];
    e->left = e->right = e->up = e->down = e;
    e->row = e->col = -1;
  }

  return m;
}